

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::OP_LdCustomSpreadIteratorList(Var aRight,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  Type TVar2;
  ThreadContext *this;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Attributes attributes;
  BOOL BVar6;
  RecyclableObject *this_00;
  JavascriptMethod p_Var7;
  JavascriptArray *pJVar8;
  JavascriptMethod p_Var9;
  Recycler *pRVar10;
  SpreadArgument *this_01;
  DynamicType *type;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(aRight);
  JavascriptLibrary::EnsureArrayBuiltInsAreReady
            ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  this_00 = GetIteratorFunction(aRight,scriptContext,false);
  p_Var7 = RecyclableObject::GetEntryPoint(this_00);
  bVar3 = JavascriptArray::IsNonES5Array(aRight);
  if ((((bVar3) &&
       (bVar3 = JavascriptLibrary::IsDefaultArrayValuesFunction(this_00,scriptContext), bVar3)) &&
      (pJVar8 = UnsafeVarTo<Js::JavascriptArray>(aRight),
      (((pJVar8->head).ptr)->next).ptr == (SparseArraySegmentBase *)0x0)) &&
     (pJVar8 = UnsafeVarTo<Js::JavascriptArray>(aRight), ((pJVar8->head).ptr)->left == 0)) {
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>(aRight);
    TVar2 = ((pJVar8->head).ptr)->length;
    pJVar8 = VarTo<Js::JavascriptArray>(aRight);
    if (TVar2 != (pJVar8->super_ArrayObject).length) goto LAB_00998a8d;
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>(aRight);
    bVar3 = JavascriptArray::HasNoMissingValues(pJVar8);
    if (!bVar3) goto LAB_00998a8d;
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>(aRight);
    iVar5 = (*(pJVar8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])(pJVar8);
    if (iVar5 != 0) goto LAB_00998a8d;
LAB_00998aaa:
    bVar3 = JavascriptLibrary::ArrayIteratorPrototypeHasUserDefinedNext(scriptContext);
    if (!bVar3) {
      local_58 = (undefined1  [8])&SpreadArgument::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_4d342ea;
      data.filename._0_4_ = 0x635;
      pRVar10 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58)
      ;
      this_01 = (SpreadArgument *)new<Memory::Recycler>(0x28,pRVar10,0x37a1d4);
      type = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->SpreadArgumentType).ptr;
      bVar3 = true;
      goto LAB_00998be4;
    }
  }
  else {
LAB_00998a8d:
    bVar3 = VarIs<Js::TypedArrayBase>(aRight);
    if ((bVar3) &&
       (p_Var9 = FunctionInfo::GetOriginalEntryPoint
                           ((FunctionInfo *)TypedArrayBase::EntryInfo::Values), p_Var7 == p_Var9))
    goto LAB_00998aaa;
  }
  this = scriptContext->threadContext;
  bVar3 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_58 = (undefined1  [8])this;
  data.typeinfo = (type_info *)this_00;
  data.plusSize = (size_t)aRight;
  attributes = FunctionInfo::GetAttributes(this_00);
  bVar4 = ThreadContext::HasNoSideEffect(this,this_00,attributes);
  if (bVar4) {
    aRight = OP_LdCustomSpreadIteratorList::anon_class_24_3_32208331::operator()
                       ((anon_class_24_3_32208331 *)local_58);
    bVar4 = ThreadContext::IsOnStack(aRight);
LAB_00998b0c:
    if (bVar4 != false) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      aRight = OP_LdCustomSpreadIteratorList::anon_class_24_3_32208331::operator()
                         ((anon_class_24_3_32208331 *)local_58);
      bVar4 = ThreadContext::IsOnStack(aRight);
      goto LAB_00998b0c;
    }
    IVar1 = this->implicitCallFlags;
    aRight = OP_LdCustomSpreadIteratorList::anon_class_24_3_32208331::operator()
                       ((anon_class_24_3_32208331 *)local_58);
    this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    aRight = (((((((((this_00->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  this->reentrancySafeOrHandled = bVar3;
  BVar6 = IsObject(aRight);
  if (BVar6 == 0) {
    bVar3 = ThreadContext::RecordImplicitException(this);
    if (!bVar3) {
      return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec71,(PCWSTR)0x0);
  }
  local_58 = (undefined1  [8])&SpreadArgument::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_4d342ea;
  data.filename._0_4_ = 0x649;
  pRVar10 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  this_01 = (SpreadArgument *)new<Memory::Recycler>(0x28,pRVar10,0x37a1d4);
  type = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->SpreadArgumentType).ptr;
  bVar3 = false;
LAB_00998be4:
  SpreadArgument::SpreadArgument(this_01,aRight,bVar3,type);
  return this_01;
}

Assistant:

Var JavascriptOperators::OP_LdCustomSpreadIteratorList(Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_ToSpreadedFunctionArgument);
#if ENABLE_COPYONACCESS_ARRAY
        // We know we're going to read from this array. Do the conversion before we try to perform checks on the head segment.
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray(aRight);
#endif

#ifdef ENABLE_JS_BUILTINS
        scriptContext->GetLibrary()->EnsureArrayBuiltInsAreReady();
#endif

        RecyclableObject* function = GetIteratorFunction(aRight, scriptContext);
        JavascriptMethod method = function->GetEntryPoint();
        if (((JavascriptArray::IsNonES5Array(aRight) &&
              (
                  JavascriptLibrary::IsDefaultArrayValuesFunction(function, scriptContext)
                  // Verify that the head segment of the array covers all elements with no gaps.
                  // Accessing an element on the prototype could have side-effects that would invalidate the optimization.
                  && UnsafeVarTo<JavascriptArray>(aRight)->GetHead()->next == nullptr
                  && UnsafeVarTo<JavascriptArray>(aRight)->GetHead()->left == 0
                  && UnsafeVarTo<JavascriptArray>(aRight)->GetHead()->length == VarTo<JavascriptArray>(aRight)->GetLength()
                  && UnsafeVarTo<JavascriptArray>(aRight)->HasNoMissingValues()
                  && !UnsafeVarTo<JavascriptArray>(aRight)->IsCrossSiteObject()
              )) ||
             (VarIs<TypedArrayBase>(aRight) && method == TypedArrayBase::EntryInfo::Values.GetOriginalEntryPoint()))
            // We can't optimize away the iterator if the array iterator prototype is user defined.
            && !JavascriptLibrary::ArrayIteratorPrototypeHasUserDefinedNext(scriptContext))
        {
            return RecyclerNew(scriptContext->GetRecycler(), SpreadArgument, aRight, true /*useDirectCall*/, scriptContext->GetLibrary()->GetSpreadArgumentType());
        }

        ThreadContext *threadContext = scriptContext->GetThreadContext();

        Var iteratorVar =
            threadContext->ExecuteImplicitCall(function, ImplicitCall_Accessor, [=]() -> Var
            {
                return CALL_FUNCTION(threadContext, function, CallInfo(Js::CallFlags_Value, 1), aRight);
            });

        if (!JavascriptOperators::IsObject(iteratorVar))
        {
            if (!threadContext->RecordImplicitException())
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
        }

        return RecyclerNew(scriptContext->GetRecycler(), SpreadArgument, iteratorVar, false /*useDirectCall*/, scriptContext->GetLibrary()->GetSpreadArgumentType());
        JIT_HELPER_END(Op_ToSpreadedFunctionArgument);
    }